

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-mongo.c
# Opt level: O3

int op_kill(lua_State *L)

{
  char *pcVar1;
  size_t cursor_len;
  size_t local_a8;
  undefined4 local_a0;
  undefined4 local_9c;
  char *local_98;
  char local_90 [24];
  undefined8 local_78;
  
  local_a8 = 0;
  pcVar1 = luaL_tolstring(L,1,&local_a8);
  if (local_a8 == 8) {
    local_9c = 0x80;
    local_90[4] = '\0';
    local_90[5] = '\0';
    local_90[6] = '\0';
    local_90[7] = '\0';
    local_90[8] = '\0';
    local_90[9] = '\0';
    local_90[10] = '\0';
    local_90[0xb] = '\0';
    local_90[0xc] = -0x29;
    local_90[0xd] = '\a';
    local_90[0xe] = '\0';
    local_90[0xf] = '\0';
    local_90[0x10] = '\0';
    local_90[0x11] = '\0';
    local_90[0x12] = '\0';
    local_90[0x13] = '\0';
    local_90[0x14] = '\x01';
    local_90[0x15] = '\0';
    local_90[0x16] = '\0';
    local_90[0x17] = '\0';
    local_78 = *(undefined8 *)pcVar1;
    local_a0 = 0x20;
    local_90[0] = ' ';
    local_90[1] = '\0';
    local_90[2] = '\0';
    local_90[3] = '\0';
    local_98 = local_90;
    lua_pushlstring(L,local_90,0x20);
    if (local_98 != local_90) {
      free(local_98);
    }
    return 1;
  }
  luaL_error(L,"Invalid cursor id");
}

Assistant:

static int
op_kill(lua_State *L) {
	size_t cursor_len = 0;
	const char * cursor_id = luaL_tolstring(L, 1, &cursor_len);
	if (cursor_len != 8) {
		return luaL_error(L, "Invalid cursor id");
	}

	struct buffer buf;
	buffer_create(&buf);

	int len = reserve_length(&buf);
	write_int32(&buf, 0);
	write_int32(&buf, 0);
	write_int32(&buf, OP_KILL_CURSORS);

	write_int32(&buf, 0);
	write_int32(&buf, 1);
	write_bytes(&buf, cursor_id, 8);

	write_length(&buf, buf.size, len);

	lua_pushlstring(L, (const char *)buf.ptr, buf.size);
	buffer_destroy(&buf);

	return 1;
}